

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<anurbs::HilbertCurve<2L>,_std::shared_ptr<anurbs::HilbertCurve<2L>_>_> * __thiscall
pybind11::class_<anurbs::HilbertCurve<2l>,std::shared_ptr<anurbs::HilbertCurve<2l>>>::
def_static<unsigned_long(*)(unsigned_long,unsigned_long)noexcept>
          (class_<anurbs::HilbertCurve<2l>,std::shared_ptr<anurbs::HilbertCurve<2l>>> *this,
          char *name_,_func_unsigned_long_unsigned_long_unsigned_long **f)

{
  _func_unsigned_long_unsigned_long_unsigned_long *f_00;
  cpp_function cf;
  handle local_60;
  handle local_58;
  cpp_function local_50;
  object local_48;
  object local_40;
  name local_38;
  handle local_30;
  handle local_28;
  object local_20;
  
  f_00 = *f;
  local_48.super_handle.m_ptr = *(handle *)this;
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_38.value = name_;
  local_60.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_60.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_58.m_ptr = local_60.m_ptr;
  cpp_function::
  cpp_function<unsigned_long,unsigned_long,unsigned_long,pybind11::name,pybind11::scope,pybind11::sibling>
            (&local_50,f_00,&local_38,(scope *)&local_48,(sibling *)&local_58);
  object::~object((object *)&local_60);
  object::~object(&local_40);
  staticmethod::staticmethod((staticmethod *)&local_58,(object *)&local_50);
  cpp_function::name((cpp_function *)&local_60);
  local_30.m_ptr = *(PyObject **)this;
  if (local_60.m_ptr != (PyObject *)0x0) {
    (local_60.m_ptr)->ob_refcnt = (local_60.m_ptr)->ob_refcnt + 1;
  }
  local_28.m_ptr = local_60.m_ptr;
  local_48.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_20.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object(&local_48);
  detail::accessor_policies::obj_attr::set(local_30,local_28,local_58);
  object::~object(&local_20);
  object::~object((object *)&local_28);
  object::~object((object *)&local_60);
  object::~object((object *)&local_58);
  object::~object((object *)&local_50);
  return (class_<anurbs::HilbertCurve<2L>,_std::shared_ptr<anurbs::HilbertCurve<2L>_>_> *)this;
}

Assistant:

class_ &
    def_static(const char *name_, Func &&f, const Extra&... extra) {
        static_assert(!std::is_member_function_pointer<Func>::value,
                "def_static(...) called with a non-static member function pointer");
        cpp_function cf(std::forward<Func>(f), name(name_), scope(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = staticmethod(cf);
        return *this;
    }